

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

action_class cached_stage_for_action(proto_action *act)

{
  uint *in_RDI;
  action_class local_4;
  
  switch(*in_RDI) {
  case 0:
  case 2:
  case 3:
  case 4:
  case 5:
  case 9:
  case 10:
    local_4 = Immediate;
    break;
  case 1:
    local_4 = Bridge;
    break;
  case 6:
    local_4 = Immediate_and_Multi;
    break;
  default:
    printf("Action_type in cached_stage_for_action is %d\n",(ulong)*in_RDI);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                  ,0x554,"action_class cached_stage_for_action(proto_action *)");
  case 0xb:
    local_4 = Congestion;
  }
  return local_4;
}

Assistant:

static action_class
cached_stage_for_action(proto_action *act) {
    switch (act->action_type) {
    case Action_Congestion:
        return Congestion;
    case Action_Multi:
        return Immediate_and_Multi;
    case Action_Bridge:
        return Bridge;
    case Action_Terminal:
    case Action_Filter:
    case Action_Split:
    case Action_Immediate:
    case Action_Store:
    case Action_Thread_Bridge:
    case Action_NoAction:
        return Immediate;
    default:
	printf("Action_type in cached_stage_for_action is %d\n", act->action_type);
        assert(0);    
    }
    /*NOTREACHED*/
    return Immediate;
}